

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_init_neighbor(nhdp_neighbor *neigh)

{
  int iVar1;
  long lVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&neigh->_domaindata[0].metric.in + lVar2) = 0xffffff00ffffff;
    *(undefined8 *)((long)&neigh->_domaindata[0].best_out_link + lVar2) = 0;
    *(undefined4 *)((long)&neigh->_domaindata[0].best_out_link_metric + lVar2) = 0xffffff;
    (&neigh->_domaindata[0].willingness)[lVar2] = '\0';
    *(undefined2 *)(&neigh->_domaindata[0].local_is_mpr + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
    plVar3 = _domain_list.next;
    plVar4 = _domain_list.prev;
  } while (lVar2 != 0x80);
  for (; plVar3->prev != plVar4; plVar3 = plVar3->next) {
    if (*(char *)&plVar3[-0x28].next[2].next == '\x01') {
      iVar1 = *(int *)((long)&plVar3[-0x27].next + 4);
      neigh->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar3[-0x28].next[1].next;
      neigh->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar3[-0x28].next[1].next + 4);
      plVar4 = _domain_list.prev;
    }
  }
  return;
}

Assistant:

void
nhdp_domain_init_neighbor(struct nhdp_neighbor *neigh) {
  struct nhdp_domain *domain;
  struct nhdp_neighbor_domaindata *data;
  int i;

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    neigh->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    neigh->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;

    neigh->_domaindata[i].best_out_link = NULL;
    neigh->_domaindata[i].best_out_link_metric = RFC7181_METRIC_INFINITE;
    neigh->_domaindata[i].willingness = RFC7181_WILLINGNESS_NEVER;

    neigh->_domaindata[i].local_is_mpr = false;
    neigh->_domaindata[i].neigh_is_mpr = false;
  }

  /* initialize metrics and mprs */
  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_neighbordata(domain, neigh);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_link_start;
      data->metric.out = domain->metric->outgoing_link_start;
    }
  }
}